

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O0

QRegion * __thiscall QWidgetPrivate::getOpaqueChildren(QWidgetPrivate *this)

{
  bool bVar1;
  QPoint *p;
  qsizetype qVar2;
  QWidget *this_00;
  QWidgetPrivate *pQVar3;
  QRegion *pQVar4;
  pointer pQVar5;
  ulong uVar6;
  QWidgetPrivate *in_RDI;
  long in_FS_OFFSET;
  QWidgetPrivate *childd;
  QWidget *child;
  int i;
  QWidgetPrivate *that;
  QRegion r;
  QPoint offset;
  QRect *in_stack_ffffffffffffff68;
  QWidget *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  int local_5c;
  QWidgetPrivate *this_01;
  QRegion *local_48;
  QRect local_40;
  QRect local_30;
  QRegion local_20;
  QPoint local_18;
  QRegion local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if ((*(uint *)&in_RDI->field_0x250 >> 0x10 & 1) == 0) {
    local_48 = &in_RDI->opaqueChildren;
  }
  else {
    this_01 = in_RDI;
    QRegion::QRegion(&local_10);
    QRegion::operator=((QRegion *)in_stack_ffffffffffffff70,(QRegion *)in_stack_ffffffffffffff68);
    QRegion::~QRegion(&local_10);
    local_5c = 0;
    while( true ) {
      p = (QPoint *)(long)local_5c;
      qVar2 = QList<QObject_*>::size((QList<QObject_*> *)&in_RDI->field_0x18);
      if (qVar2 <= (long)p) break;
      QList<QObject_*>::at
                ((QList<QObject_*> *)in_stack_ffffffffffffff70,(qsizetype)in_stack_ffffffffffffff68)
      ;
      this_00 = qobject_cast<QWidget*>((QObject *)in_stack_ffffffffffffff68);
      if (((this_00 != (QWidget *)0x0) && (bVar1 = QWidget::isVisible((QWidget *)0x365e61), bVar1))
         && (bVar1 = QWidget::isWindow(in_stack_ffffffffffffff70), !bVar1)) {
        local_18 = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
        QWidget::geometry(this_00);
        local_18 = QRect::topLeft(in_stack_ffffffffffffff68);
        pQVar3 = QWidget::d_func((QWidget *)0x365eaf);
        local_20.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
        if ((*(uint *)&pQVar3->field_0x250 >> 0x11 & 1) == 0) {
          pQVar4 = getOpaqueChildren(this_01);
          QRegion::QRegion(&local_20,(QRegion *)pQVar4);
        }
        else {
          local_30 = QWidget::rect((QWidget *)
                                   CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
          QRegion::QRegion(&local_20,(QRect *)&local_30,Rectangle);
        }
        bVar1 = std::unique_ptr::operator_cast_to_bool
                          ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x365f22);
        if ((bVar1) &&
           (pQVar5 = std::unique_ptr<QWExtra,_std::default_delete<QWExtra>_>::operator->
                               ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x365f36),
           (*(ushort *)&pQVar5->field_0x7c >> 7 & 1) != 0)) {
          pQVar5 = std::unique_ptr<QWExtra,_std::default_delete<QWExtra>_>::operator->
                             ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x365f58);
          QRegion::operator&=(&local_20,(QRegion *)&pQVar5->mask);
        }
        uVar6 = QRegion::isEmpty();
        if ((uVar6 & 1) == 0) {
          QRegion::translate((QRegion *)in_RDI,p);
          QRegion::operator+=(&this_01->opaqueChildren,(QRegion *)&local_20);
          in_stack_ffffffffffffff8c = 0;
        }
        else {
          in_stack_ffffffffffffff8c = 4;
        }
        QRegion::~QRegion(&local_20);
      }
      local_5c = local_5c + 1;
    }
    q_func(in_RDI);
    local_40 = QWidget::rect((QWidget *)
                             CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    QRegion::operator&=(&this_01->opaqueChildren,(QRect *)&local_40);
    *(uint *)&this_01->field_0x250 = *(uint *)&this_01->field_0x250 & 0xfffeffff;
    local_48 = &this_01->opaqueChildren;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_48;
}

Assistant:

const QRegion &QWidgetPrivate::getOpaqueChildren() const
{
    if (!dirtyOpaqueChildren)
        return opaqueChildren;

    QWidgetPrivate *that = const_cast<QWidgetPrivate*>(this);
    that->opaqueChildren = QRegion();

    for (int i = 0; i < children.size(); ++i) {
        QWidget *child = qobject_cast<QWidget *>(children.at(i));
        if (!child || !child->isVisible() || child->isWindow())
            continue;

        const QPoint offset = child->geometry().topLeft();
        QWidgetPrivate *childd = child->d_func();
        QRegion r = childd->isOpaque ? child->rect() : childd->getOpaqueChildren();
        if (childd->extra && childd->extra->hasMask)
            r &= childd->extra->mask;
        if (r.isEmpty())
            continue;
        r.translate(offset);
        that->opaqueChildren += r;
    }

    that->opaqueChildren &= q_func()->rect();
    that->dirtyOpaqueChildren = false;

    return that->opaqueChildren;
}